

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * get_next_command_abi_cxx11_(void)

{
  _Alloc_hider _Var1;
  int iVar2;
  char *__s;
  size_t sVar3;
  void *pvVar4;
  size_type sVar5;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"quit","");
  if ((((byte)std::getline<char,std::char_traits<char>,std::allocator<char>>
              [*(long *)(std::cin + -0x18)] & 2) == 0) &&
     (__s = (char *)readline("eval> "), __s != (char *)0x0)) {
    add_history(__s);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + sVar3);
    sVar5 = local_58._M_string_length;
    _Var1._M_p = local_58._M_dataplus._M_p;
    __n = 0xffffffffffffffff;
    if (local_58._M_string_length != 0) {
      __n = 0;
      local_38 = &in_RDI->field_2;
      do {
        pvVar4 = memchr("\t \n",(int)_Var1._M_p[__n],3);
        if (pvVar4 == (void *)0x0) goto LAB_0029dbbf;
        __n = __n + 1;
      } while (sVar5 != __n);
      __n = 0xffffffffffffffff;
    }
LAB_0029dbbf:
    if (__n != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_58,0,__n);
    }
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(&local_58,"\t \n",0xffffffffffffffff,3);
    if (sVar5 != 0xffffffffffffffff) {
      if (local_58._M_string_length <= sVar5) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
      }
      local_58._M_dataplus._M_p[sVar5 + 1] = '\0';
      local_58._M_string_length = sVar5 + 1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (in_RDI,&local_58);
    free(__s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (in_RDI,"quit");
  if ((((iVar2 == 0) ||
       (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(in_RDI,"exit"), iVar2 == 0)) ||
      (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(in_RDI,"help"), iVar2 == 0)) ||
     (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_RDI,"version"), iVar2 == 0)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_RDI,"(0)");
  }
  return in_RDI;
}

Assistant:

std::string get_next_command() {
  std::string retval("quit");
  if (!std::cin.eof()) {
    char *input_raw = readline("eval> ");
    if (input_raw != nullptr) {
      add_history(input_raw);

      std::string val(input_raw);
      size_t pos = val.find_first_not_of("\t \n");
      if (pos != std::string::npos) {
        val.erase(0, pos);
      }
      pos = val.find_last_not_of("\t \n");
      if (pos != std::string::npos) {
        val.erase(pos + 1, std::string::npos);
      }

      retval = val;

      ::free(input_raw);
    }
  }
  if (retval == "quit" || retval == "exit" || retval == "help" || retval == "version") {
    retval += "(0)";
  }
  return retval;
}